

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifold_test.cpp
# Opt level: O0

void __thiscall
Manifold_PartialRevolveOffset_Test::TestBody(Manifold_PartialRevolveOffset_Test *this)

{
  pointer pvVar1;
  bool bVar2;
  reference this_00;
  pointer pvVar3;
  char *pcVar4;
  double dVar5;
  AssertHelper local_f8;
  Message local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_2;
  Message local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_1;
  Message local_b0;
  int local_a8;
  int local_a4;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar;
  vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  local_80;
  undefined1 local_68 [8];
  Polygons rotatedPolys;
  size_t i;
  Manifold local_38 [8];
  Manifold revolute;
  undefined1 local_28 [8];
  Polygons polys;
  Manifold_PartialRevolveOffset_Test *this_local;
  
  polys.
  super__Vector_base<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  SquareHole((Polygons *)local_28,10.0);
  manifold::Manifold::Manifold(local_38);
  rotatedPolys.
  super__Vector_base<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    pvVar1 = rotatedPolys.
             super__Vector_base<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    this_00 = std::
              vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
              ::operator[]((vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
                            *)local_28,0);
    pvVar3 = (pointer)std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>
                      ::size(this_00);
    if (pvVar3 <= pvVar1) break;
    std::
    vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
    ::vector(&local_80,
             (vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
              *)local_28);
    RotatePolygons((Polygons *)local_68,&local_80,
                   (int)rotatedPolys.
                        super__Vector_base<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
    ::~vector(&local_80);
    manifold::Manifold::Revolve((vector *)&gtest_ar.message_,(int)local_68,180.0);
    manifold::Manifold::operator=(local_38,(Manifold *)&gtest_ar.message_);
    manifold::Manifold::~Manifold((Manifold *)&gtest_ar.message_);
    local_a4 = manifold::Manifold::Genus();
    local_a8 = 1;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_a0,"revolute.Genus()","1",&local_a4,&local_a8);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
    if (!bVar2) {
      testing::Message::Message(&local_b0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
                 ,0x163,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
    dVar5 = (double)manifold::Manifold::SurfaceArea();
    testing::internal::DoubleNearPredFormat
              ((internal *)local_c8,"revolute.SurfaceArea()","777.0","1.0",dVar5,777.0,1.0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
    if (!bVar2) {
      testing::Message::Message(&local_d0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
                 ,0x164,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
    dVar5 = (double)manifold::Manifold::Volume();
    testing::internal::DoubleNearPredFormat
              ((internal *)local_e8,"revolute.Volume()","376.0","1.0",dVar5,376.0,1.0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
    if (!bVar2) {
      testing::Message::Message(&local_f0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
                 ,0x165,pcVar4);
      testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      testing::Message::~Message(&local_f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
    std::
    vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
    ::~vector((vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
               *)local_68);
    rotatedPolys.
    super__Vector_base<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&((rotatedPolys.
                            super__Vector_base<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                          super__Vector_base<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1);
  }
  manifold::Manifold::~Manifold(local_38);
  std::
  vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  ::~vector((vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
             *)local_28);
  return;
}

Assistant:

TEST(Manifold, PartialRevolveOffset) {
  Polygons polys = SquareHole(10.0);

  Manifold revolute;
  for (size_t i = 0; i < polys[0].size(); i++) {
    Polygons rotatedPolys = RotatePolygons(polys, i);
    revolute = Manifold::Revolve(rotatedPolys, 48, 180);
    EXPECT_EQ(revolute.Genus(), 1);
    EXPECT_NEAR(revolute.SurfaceArea(), 777.0, 1.0);
    EXPECT_NEAR(revolute.Volume(), 376.0, 1.0);
  }
}